

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionRewind.cpp
# Opt level: O0

int __thiscall
Hpipe::InstructionRewind::clone
          (InstructionRewind *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  InstructionOK *pIVar1;
  Context local_98;
  undefined8 local_28;
  Vec<unsigned_int> *keep_ind_local;
  Context *ncx_local;
  PtrPool<Hpipe::Instruction,_32> *inst_pool_local;
  InstructionRewind *this_local;
  
  local_28 = ___flags;
  keep_ind_local = (Vec<unsigned_int> *)__child_stack;
  ncx_local = (Context *)__fn;
  inst_pool_local = (PtrPool<Hpipe::Instruction,_32> *)this;
  pIVar1 = (InstructionOK *)operator_new(0x178);
  Context::Context(&local_98,(Context *)keep_ind_local);
  InstructionOK::Instruction(pIVar1,&local_98);
  pIVar1 = PtrPool<Hpipe::Instruction,32>::operator<<((PtrPool<Hpipe::Instruction,32> *)__fn,pIVar1)
  ;
  Context::~Context(&local_98);
  return (int)pIVar1;
}

Assistant:

Instruction *InstructionRewind::clone( PtrPool<Instruction> &inst_pool, const Context &ncx, const Vec<unsigned> &keep_ind ) {
    // return inst_pool << new InstructionRewind( ncx );
    return inst_pool << new InstructionOK( ncx );
}